

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplaceRealloc<slang::Diagnostic_const&>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Diagnostic *args)

{
  Diagnostic *pDVar1;
  size_type sVar2;
  iterator pDVar3;
  long lVar4;
  pointer pDVar5;
  iterator __result;
  iterator in_RSI;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Diagnostic *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  Diagnostic *this_00;
  
  this_00 = (Diagnostic *)in_RDI->len;
  pDVar1 = (Diagnostic *)max_size((SmallVectorBase<slang::Diagnostic> *)0x66437b);
  if (this_00 == pDVar1) {
    detail::throwLengthError();
  }
  sVar2 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pDVar3 = begin(in_RDI);
  lVar4 = (long)__last - (long)pDVar3;
  pDVar5 = (pointer)operator_new(0x6643dd);
  Diagnostic::Diagnostic(this_00,(Diagnostic *)in_RDI);
  pDVar3 = end(in_RDI);
  if (in_RSI == pDVar3) {
    __result = begin(in_RDI);
    pDVar3 = end(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>(in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pDVar3 = end(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pDVar3);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar2;
  in_RDI->data_ = pDVar5;
  return pDVar5 + lVar4 / 0x70;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}